

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_tests.cpp
# Opt level: O1

void __thiscall span_tests::span_constructor_sfinae::test_method(span_constructor_sfinae *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  check_type cVar3;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  assertion_result local_f0;
  char **local_d8;
  char *local_d0;
  element_type *local_c8;
  shared_count sStack_c0;
  _Base_ptr local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  char *local_78;
  char *local_70;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_70 = "";
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x3f;
  file.m_begin = (iterator)&local_78;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_88,msg);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_d0;
  local_d0 = "Spannable(std::vector<int>{})";
  local_c8 = (element_type *)0xf3f2ee;
  local_68._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_68._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  local_68._M_impl._0_8_ = &PTR__lazy_ostream_013abc70;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_90 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,(lazy_ostream *)&local_68,1,0,WARN,_cVar3,(size_t)&local_98,0x3f);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_a0 = "";
  local_b8 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x40;
  file_00.m_begin = (iterator)&local_a8;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_b8,msg_00
            );
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl._0_8_ = (_func_int **)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d0 = (char *)CONCAT71(local_d0._1_7_,1);
  local_c8 = (element_type *)0x0;
  sStack_c0.pi_ = (sp_counted_base *)0x0;
  local_d8 = &local_100;
  local_100 = "!Spannable(std::set<int>{})";
  local_f8 = "";
  local_f0.m_message.px = (element_type *)((ulong)local_f0.m_message.px & 0xffffffffffffff00);
  local_f0._0_8_ = &PTR__lazy_ostream_013abc70;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_108 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_d0,(lazy_ostream *)&local_f0,1,0,WARN,_cVar3,
             (size_t)&local_110,0x40);
  boost::detail::shared_count::~shared_count(&sStack_c0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_68);
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x41;
  file_01.m_begin = (iterator)&local_120;
  msg_01.m_end = pvVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_130,
             msg_01);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = "!Spannable(std::vector<bool>{})";
  local_c8 = (element_type *)0xf3f32a;
  local_68._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_68._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  local_68._M_impl._0_8_ = &PTR__lazy_ostream_013abc70;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_138 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,(lazy_ostream *)&local_68,1,0,WARN,_cVar3,(size_t)&local_140,0x41);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x42;
  file_02.m_begin = (iterator)&local_150;
  msg_02.m_end = pvVar2;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_160,
             msg_02);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = "Spannable(std::array<int, 3>{})";
  local_c8 = (element_type *)0xf3f34a;
  local_68._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_68._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  local_68._M_impl._0_8_ = &PTR__lazy_ostream_013abc70;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_168 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,(lazy_ostream *)&local_68,1,0,WARN,_cVar3,(size_t)&local_170,0x42);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x43;
  file_03.m_begin = (iterator)&local_180;
  msg_03.m_end = pvVar2;
  msg_03.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_190,
             msg_03);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = "Spannable(Span<int>{})";
  local_c8 = (element_type *)0xf3f361;
  local_68._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_68._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  local_68._M_impl._0_8_ = &PTR__lazy_ostream_013abc70;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_198 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,(lazy_ostream *)&local_68,1,0,WARN,_cVar3,(size_t)&local_1a0,0x43);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x44;
  file_04.m_begin = (iterator)&local_1b0;
  msg_04.m_end = pvVar2;
  msg_04.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1c0,
             msg_04);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = "Spannable(\"char array\")";
  local_c8 = (element_type *)0xf3f379;
  local_68._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_68._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  local_68._M_impl._0_8_ = &PTR__lazy_ostream_013abc70;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_1c8 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,(lazy_ostream *)&local_68,1,0,WARN,_cVar3,(size_t)&local_1d0,0x44);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x45;
  file_05.m_begin = (iterator)&local_1e0;
  msg_05.m_end = pvVar2;
  msg_05.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1f0,
             msg_05);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = "Spannable(SpannableYes{})";
  local_c8 = (element_type *)0xf3f393;
  local_68._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_68._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  local_68._M_impl._0_8_ = &PTR__lazy_ostream_013abc70;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_1f8 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,(lazy_ostream *)&local_68,1,0,WARN,_cVar3,(size_t)&local_200,0x45);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x46;
  file_06.m_begin = (iterator)&local_210;
  msg_06.m_end = pvVar2;
  msg_06.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_220,
             msg_06);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = "!Spannable(SpannableNo{})";
  local_c8 = (element_type *)0xf3f3ad;
  local_68._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_68._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  local_68._M_impl._0_8_ = &PTR__lazy_ostream_013abc70;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,(lazy_ostream *)&local_68,1,0,WARN,0xf3f255,(size_t)&stack0xfffffffffffffdd0,
             0x46);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(span_constructor_sfinae)
{
    BOOST_CHECK(Spannable(std::vector<int>{}));
    BOOST_CHECK(!Spannable(std::set<int>{}));
    BOOST_CHECK(!Spannable(std::vector<bool>{}));
    BOOST_CHECK(Spannable(std::array<int, 3>{}));
    BOOST_CHECK(Spannable(Span<int>{}));
    BOOST_CHECK(Spannable("char array"));
    BOOST_CHECK(Spannable(SpannableYes{}));
    BOOST_CHECK(!Spannable(SpannableNo{}));
}